

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<pbrt::Image>::construct<pbrt::Image,pbrt::Image>
          (polymorphic_allocator<pbrt::Image> *this,Image *p,Image *args)

{
  Image *in_stack_00000018;
  Image *in_stack_00000020;
  
  pbrt::Image::Image(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }